

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  int iVar3;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double *pdVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  pFVar4 = (this->left_->fadexpr_).right_;
  pFVar5 = (pFVar4->fadexpr_).right_;
  pdVar9 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar9 = (pFVar5->dx_).ptr_to_data + i;
  }
  dVar1 = (pFVar4->fadexpr_).left_.constant_;
  dVar2 = *pdVar9;
  iVar3 = (this->left_->fadexpr_).left_.constant_;
  dVar7 = dVar1 * pFVar5->val_;
  dVar10 = ((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ /
           (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  pFVar5 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pdVar9 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar9 = (pFVar5->dx_).ptr_to_data + i;
  }
  dVar11 = (this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  auVar12._0_8_ = *pdVar9 / dVar11;
  dVar11 = pFVar5->val_ / dVar11;
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  auVar12._8_8_ = (double)(this->left_->fadexpr_).left_.constant_;
  pFVar4 = (this->left_->fadexpr_).right_;
  dVar8 = ((pFVar4->fadexpr_).right_)->val_ * (pFVar4->fadexpr_).left_.constant_;
  auVar6._8_4_ = SUB84(dVar8,0);
  auVar6._0_8_ = dVar11 * 2.0;
  auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar12 = divpd(auVar12,auVar6);
  return (((double)iVar3 * -dVar2 * dVar1) / (dVar7 * dVar7)) * dVar10 +
         auVar12._8_8_ * auVar12._0_8_;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}